

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_std::tuple<>_&> * testing::A<std::tuple<>const&>(void)

{
  MatcherInterface<const_std::tuple<>_&> *pMVar1;
  Matcher<const_std::tuple<>_&> *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tuple<>_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_0017ab28;
  (in_RDI->super_MatcherBase<const_std::tuple<>_&>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<const_std::tuple<>_&>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<const_std::tuple<>_&>).impl_.link_;
  (in_RDI->super_MatcherBase<const_std::tuple<>_&>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_0017aaf0;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }